

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void set_bang(t_set *x)

{
  int iVar1;
  t_gstub *ptVar2;
  t_pd p_Var3;
  int iVar4;
  t_gpointer *gp_00;
  t_template *ptVar5;
  t_symbol *ptVar6;
  _glist *local_50;
  _array *owner_array;
  t_word *vec;
  t_gstub *gs;
  t_gpointer *gp;
  t_setvariable *vp;
  t_template *template;
  t_symbol *templatesym;
  int i;
  int nitems;
  t_set *x_local;
  
  iVar1 = x->x_nin;
  gp_00 = &x->x_gp;
  ptVar2 = (x->x_gp).gp_stub;
  iVar4 = gpointer_check(gp_00,0);
  if (iVar4 == 0) {
    pd_error(x,"set: empty pointer");
  }
  else {
    if (*x->x_templatesym->s_name == '\0') {
      template = (t_template *)gpointer_gettemplatesym(gp_00);
    }
    else {
      template = (t_template *)x->x_templatesym;
      ptVar5 = (t_template *)gpointer_gettemplatesym(gp_00);
      if (template != ptVar5) {
        p_Var3 = template->t_pdobj;
        ptVar6 = gpointer_gettemplatesym(gp_00);
        pd_error(x,"set %s: got wrong template (%s)",p_Var3,ptVar6->s_name);
        return;
      }
    }
    ptVar5 = template_findbyname((t_symbol *)template);
    if (ptVar5 == (t_template *)0x0) {
      pd_error(x,"set: couldn\'t find template %s",template->t_pdobj);
    }
    else if (iVar1 != 0) {
      if (ptVar2->gs_which == 2) {
        owner_array = (_array *)(gp_00->gp_un).gp_scalar;
      }
      else {
        owner_array = (_array *)((gp_00->gp_un).gp_scalar)->sc_vec;
      }
      if (x->x_issymbol == 0) {
        templatesym._0_4_ = 0;
        gp = (t_gpointer *)x->x_variables;
        for (; (int)templatesym < iVar1; templatesym._0_4_ = (int)templatesym + 1) {
          template_setfloat(ptVar5,(t_symbol *)(gp->gp_un).gp_scalar,(t_word *)owner_array,
                            (t_float)gp->gp_valid,1);
          gp = (t_gpointer *)&gp->gp_stub;
        }
      }
      else {
        templatesym._0_4_ = 0;
        gp = (t_gpointer *)x->x_variables;
        for (; (int)templatesym < iVar1; templatesym._0_4_ = (int)templatesym + 1) {
          template_setsymbol(ptVar5,(t_symbol *)(gp->gp_un).gp_scalar,(t_word *)owner_array,
                             *(t_symbol **)&gp->gp_valid,1);
          gp = (t_gpointer *)&gp->gp_stub;
        }
      }
      if (ptVar2->gs_which == 1) {
        scalar_redraw((gp_00->gp_un).gp_scalar,(ptVar2->gs_un).gs_glist);
      }
      else {
        local_50 = (ptVar2->gs_un).gs_glist;
        while (*(int *)&local_50->gl_list->g_next == 2) {
          local_50 = (_glist *)local_50->gl_list->g_pd;
        }
        scalar_redraw((t_scalar *)(local_50->gl_obj).te_inlet,(_glist *)local_50->gl_list->g_pd);
      }
    }
  }
  return;
}

Assistant:

static void set_bang(t_set *x)
{
    int nitems = x->x_nin, i;
    t_symbol *templatesym;
    t_template *template;
    t_setvariable *vp;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "set: empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) != gpointer_gettemplatesym(gp))
        {
            pd_error(x, "set %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "set: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!nitems)
        return;
    if (gs->gs_which == GP_ARRAY)
        vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    if (x->x_issymbol)
        for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
            template_setsymbol(template, vp->gv_sym, vec, vp->gv_w.w_symbol, 1);
    else for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
        template_setfloat(template, vp->gv_sym, vec, vp->gv_w.w_float, 1);
    if (gs->gs_which == GP_GLIST)
        scalar_redraw(gp->gp_un.gp_scalar, gs->gs_un.gs_glist);
    else
    {
        t_array *owner_array = gs->gs_un.gs_array;
        while (owner_array->a_gp.gp_stub->gs_which == GP_ARRAY)
            owner_array = owner_array->a_gp.gp_stub->gs_un.gs_array;
        scalar_redraw(owner_array->a_gp.gp_un.gp_scalar,
            owner_array->a_gp.gp_stub->gs_un.gs_glist);
    }
}